

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlBufGetNodeContent(void)

{
  int iVar1;
  int iVar2;
  uint local_34;
  int n_cur;
  xmlNode *cur;
  int n_buf;
  xmlBufPtr buf;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (cur._4_4_ = 0; (int)cur._4_4_ < 1; cur._4_4_ = cur._4_4_ + 1) {
    for (local_34 = 0; (int)local_34 < 1; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      iVar2 = xmlBufGetNodeContent(0,0);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufGetNodeContent",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)cur._4_4_);
        printf(" %d",(ulong)local_34);
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlBufGetNodeContent(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlBufPtr buf; /* a buffer xmlBufPtr */
    int n_buf;
    const xmlNode * cur; /* the node being read */
    int n_cur;

    for (n_buf = 0;n_buf < gen_nb_xmlBufPtr;n_buf++) {
    for (n_cur = 0;n_cur < gen_nb_const_xmlNode_ptr;n_cur++) {
        mem_base = xmlMemBlocks();
        buf = gen_xmlBufPtr(n_buf, 0);
        cur = gen_const_xmlNode_ptr(n_cur, 1);

        ret_val = xmlBufGetNodeContent(buf, cur);
        desret_int(ret_val);
        call_tests++;
        des_xmlBufPtr(n_buf, buf, 0);
        des_const_xmlNode_ptr(n_cur, cur, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlBufGetNodeContent",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buf);
            printf(" %d", n_cur);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}